

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::FindProgram
                   (string *__return_storage_ptr__,char *nameIn,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  size_t sVar1;
  string local_50;
  
  if ((nameIn == (char *)0x0) || (*nameIn == '\0')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen(nameIn);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,nameIn,nameIn + sVar1);
    FindProgram(__return_storage_ptr__,&local_50,userPaths,no_system_path);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::FindProgram(
  const char* nameIn,
  const kwsys_stl::vector<kwsys_stl::string>& userPaths,
  bool no_system_path)
{
  if(!nameIn || !*nameIn)
    {
    return "";
    }
  return SystemTools::FindProgram(kwsys_stl::string(nameIn), userPaths, no_system_path);
}